

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O1

void __thiscall trimesh::mscomplex_t::connect_cps(mscomplex_t *this,int p,int q)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  int __c;
  int __c_00;
  int __c_01;
  undefined4 in_register_00000034;
  key_type_conflict i;
  char *pcVar8;
  stringstream ss;
  key_type_conflict local_1d8 [8];
  uint local_1b8 [4];
  ostream local_1a8 [376];
  
  pcVar2 = index(this,(char *)CONCAT44(in_register_00000034,p),q);
  pcVar3 = index(this,(char *)(ulong)(uint)q,__c);
  pcVar8 = (char *)(ulong)(uint)p;
  if ((int)pcVar2 < (int)pcVar3) {
    pcVar8 = (char *)(ulong)(uint)q;
    q = p;
  }
  i = (key_type_conflict)pcVar8;
  pcVar8 = index(this,pcVar8,__c_00);
  pcVar2 = index(this,(char *)(ulong)(uint)q,__c_01);
  if ((int)pcVar8 != (int)pcVar2 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to assert condition ",0x1b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"index(p) == index(q)+1",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"connect_cps",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
    poVar6 = (ostream *)std::ostream::operator<<(local_1a8,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") \n ",4);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1d8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = is_not_paired(this,i);
  if ((bVar1) && (bVar1 = is_not_paired(this,q), bVar1)) {
    local_1b8[0] = q;
    sVar4 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->m_des_conn->
                     super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)i]._M_t,local_1b8);
    local_1d8[0] = i;
    sVar5 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->m_asc_conn->
                     super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[q]._M_t,local_1d8);
    if (sVar4 != sVar5) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Failed to assert condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"m_des_conn[p].count(q) == m_asc_conn[q].count(p)",0x30);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"connect_cps",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      poVar6 = (ostream *)std::ostream::operator<<(local_1a8,0x11c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") \n ",4);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar7,(string *)local_1d8);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0] = q;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_equal<unsigned_int>
              (&(this->m_des_conn->
                super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[(int)i]._M_t,local_1b8);
    local_1b8[0] = i;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_equal<unsigned_int>
              (&(this->m_asc_conn->
                super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[q]._M_t,local_1b8);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to assert condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"is_not_paired(p) && is_not_paired(q)",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
             ,0x69);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"connect_cps",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
  poVar6 = (ostream *)std::ostream::operator<<(local_1a8,0x11b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") \n ",4);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,(string *)local_1d8);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mscomplex_t::connect_cps(int p, int q)
{
  order_pr_by_cp_index(*this,p,q);

  ASSERT(index(p) == index(q)+1);
  ASSERT(is_not_paired(p) && is_not_paired(q));
  ASSERT(m_des_conn[p].count(q) == m_asc_conn[q].count(p));

  m_des_conn[p].insert(q);
  m_asc_conn[q].insert(p);
}